

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_init(char *pci_addr)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined8 in_RDI;
  char buf_10 [512];
  int err_10;
  int64_t result_10;
  int vfio_fd;
  char buf_9 [512];
  int err_9;
  int64_t result_9;
  char buf_8 [512];
  int err_8;
  int64_t result_8;
  char buf_7 [512];
  int err_7;
  int64_t result_7;
  char buf_6 [512];
  int err_6;
  int64_t result_6;
  vfio_group_status group_status;
  char buf_5 [512];
  int err_5;
  int64_t result_5;
  int vfio_gfd;
  char buf_4 [512];
  int err_4;
  int64_t result_4;
  char buf_3 [512];
  int err_3;
  int64_t result_3;
  char buf_2 [512];
  int err_2;
  int64_t result_2;
  int cfd;
  int firstsetup;
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  int groupid;
  char *group_name;
  char buf [512];
  int err;
  int64_t result;
  int len;
  int ret;
  stat st;
  char iommu_group_path [4096];
  char path [4096];
  undefined1 local_3818 [516];
  int local_3614;
  long local_3610;
  int local_3604;
  long local_3600;
  undefined1 local_35f8 [28];
  int in_stack_ffffffffffffca24;
  undefined1 local_33d8 [524];
  int local_31cc;
  long local_31c8;
  long local_31c0;
  undefined1 local_31b8 [524];
  int local_2fac;
  long local_2fa8;
  long local_2fa0;
  undefined1 local_2f98 [516];
  int local_2d94;
  long local_2d90;
  ulong local_2d88;
  long local_2d80;
  undefined1 local_2d78 [516];
  int local_2b74;
  long local_2b70;
  int local_2b64;
  long local_2b60;
  undefined1 local_2b58 [524];
  int local_294c;
  long local_2948;
  long local_2940;
  undefined1 local_2938 [524];
  int local_272c;
  long local_2728;
  long local_2720;
  undefined1 local_2718 [516];
  int local_2514;
  long local_2510;
  int local_2508;
  int local_2504;
  long local_2500;
  undefined1 local_24f8 [524];
  int local_22ec;
  long local_22e8;
  uint local_22dc;
  char *local_22d8;
  ssize_t local_22d0;
  undefined1 local_22c8 [524];
  int local_20bc;
  ssize_t local_20b8;
  int local_20b0;
  int local_20ac;
  stat local_20a8;
  char local_2018 [4096];
  char local_1018 [4104];
  undefined8 local_10;
  int local_4;
  
  local_10 = in_RDI;
  snprintf(local_1018,0x1000,"/sys/bus/pci/devices/%s/",in_RDI);
  local_20ac = stat(local_1018,&local_20a8);
  if (local_20ac < 0) {
    local_4 = -1;
  }
  else {
    sVar2 = strlen(local_1018);
    strncat(local_1018,"iommu_group",0xfff - sVar2);
    local_22d0 = readlink(local_1018,local_2018,0x1000);
    local_20b8 = local_22d0;
    if (local_22d0 == -1) {
      piVar3 = __errno_location();
      local_20bc = *piVar3;
      __xpg_strerror_r(local_20bc,local_22c8,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0xec,"vfio_init","find the iommu_group for the device",local_22c8);
      exit(local_20bc);
    }
    local_20b0 = (int)local_22d0;
    local_2018[local_20b0] = '\0';
    local_22d8 = __xpg_basename(local_2018);
    iVar1 = __isoc99_sscanf(local_22d8,"%d",&local_22dc);
    local_2500 = (long)iVar1;
    local_22e8 = local_2500;
    if (local_2500 == -1) {
      piVar3 = __errno_location();
      local_22ec = *piVar3;
      __xpg_strerror_r(local_22ec,local_24f8,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0xf1,"vfio_init","convert group id to int",local_24f8);
      exit(local_22ec);
    }
    local_2504 = 0;
    local_2508 = get_vfio_container();
    if (local_2508 == -1) {
      local_2504 = 1;
      iVar1 = open("/dev/vfio/vfio",2);
      local_2720 = (long)iVar1;
      local_2510 = local_2720;
      if (local_2720 == -1) {
        piVar3 = __errno_location();
        local_2514 = *piVar3;
        __xpg_strerror_r(local_2514,local_2718,0x200);
        fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0xf8,"vfio_init","open /dev/vfio/vfio",local_2718);
        exit(local_2514);
      }
      local_2508 = iVar1;
      set_vfio_container(iVar1);
      iVar1 = ioctl(local_2508,0x3b64);
      local_2940 = (long)(int)((iVar1 == 0) - 1);
      local_2728 = local_2940;
      if (local_2940 == -1) {
        piVar3 = __errno_location();
        local_272c = *piVar3;
        __xpg_strerror_r(local_272c,local_2938,0x200);
        fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0xfc,"vfio_init","get a valid API version from the container",local_2938);
        exit(local_272c);
      }
      iVar1 = ioctl(local_2508,0x3b65,1);
      local_2b60 = (long)(int)((iVar1 == 1) - 1);
      local_2948 = local_2b60;
      if (local_2b60 == -1) {
        piVar3 = __errno_location();
        local_294c = *piVar3;
        __xpg_strerror_r(local_294c,local_2b58,0x200);
        fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0xff,"vfio_init","get Type1 IOMMU support from the IOMMU container",local_2b58);
        exit(local_294c);
      }
    }
    snprintf(local_1018,0x1000,"/dev/vfio/%d",(ulong)local_22dc);
    local_2b64 = open(local_1018,2);
    local_2d80 = (long)local_2b64;
    local_2b70 = local_2d80;
    if (local_2d80 == -1) {
      piVar3 = __errno_location();
      local_2b74 = *piVar3;
      __xpg_strerror_r(local_2b74,local_2d78,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0x104,"vfio_init","open vfio group",local_2d78);
      exit(local_2b74);
    }
    local_2d88 = 8;
    iVar1 = ioctl(local_2b64,0x3b67,&local_2d88);
    local_2fa0 = (long)iVar1;
    local_2d90 = local_2fa0;
    if (local_2fa0 == -1) {
      piVar3 = __errno_location();
      local_2d94 = *piVar3;
      __xpg_strerror_r(local_2d94,local_2f98,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0x108,"vfio_init","get VFIO group status",local_2f98);
      exit(local_2d94);
    }
    local_31c0 = (long)(int)(((local_2d88 & 0x100000000) != 0) - 1);
    local_2fa8 = local_31c0;
    if (local_31c0 == -1) {
      piVar3 = __errno_location();
      local_2fac = *piVar3;
      __xpg_strerror_r(local_2fac,local_31b8,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0x109,"vfio_init",
              "get viable VFIO group - are all devices in the group bound to the VFIO driver?",
              local_31b8);
      exit(local_2fac);
    }
    iVar1 = ioctl(local_2b64,0x3b68,&local_2508);
    local_31c8 = (long)iVar1;
    if (local_31c8 == -1) {
      piVar3 = __errno_location();
      local_31cc = *piVar3;
      __xpg_strerror_r(local_31cc,local_33d8,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0x10c,"vfio_init","set container",local_33d8);
      exit(local_31cc);
    }
    iVar1 = local_20ac;
    if (local_2504 != 0) {
      iVar1 = ioctl(local_2508,0x3b66,1);
      local_3600 = (long)iVar1;
      if (local_3600 == -1) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        __xpg_strerror_r(iVar1,local_35f8,0x200);
        fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x112,"vfio_init","set IOMMU type",local_35f8);
        exit(iVar1);
      }
    }
    local_20ac = iVar1;
    local_3604 = ioctl(local_2b64,0x3b6a,local_10);
    local_3610 = (long)local_3604;
    if (local_3610 == -1) {
      piVar3 = __errno_location();
      local_3614 = *piVar3;
      __xpg_strerror_r(local_3614,local_3818,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0x116,"vfio_init","get device fd",local_3818);
      exit(local_3614);
    }
    vfio_enable_dma(in_stack_ffffffffffffca24);
    local_4 = local_3604;
  }
  return local_4;
}

Assistant:

int vfio_init(const char* pci_addr) {
	// find iommu group for the device
	// `readlink /sys/bus/pci/device/<segn:busn:devn.funcn>/iommu_group`
	char path[PATH_MAX], iommu_group_path[PATH_MAX];
	struct stat st;
	snprintf(path, sizeof(path), "/sys/bus/pci/devices/%s/", pci_addr);
	int ret = stat(path, &st);
	if (ret < 0) {
		// No such device
		return -1;
	}
	strncat(path, "iommu_group", sizeof(path) - strlen(path) - 1);

	int len = check_err(readlink(path, iommu_group_path, sizeof(iommu_group_path)), "find the iommu_group for the device");

	iommu_group_path[len] = '\0'; // append 0x00 to the string to end it
	char* group_name = basename(iommu_group_path);
	int groupid;
	check_err(sscanf(group_name, "%d", &groupid), "convert group id to int");

	int firstsetup = 0; // Need to set up the container exactly once
	int cfd = get_vfio_container();
	if (cfd == -1) {
		firstsetup = 1;
		// open vfio file to create new vfio container
		cfd = check_err(open("/dev/vfio/vfio", O_RDWR), "open /dev/vfio/vfio");
		set_vfio_container(cfd);

		// check if the container's API version is the same as the VFIO API's
		check_err((ioctl(cfd, VFIO_GET_API_VERSION) == VFIO_API_VERSION) - 1, "get a valid API version from the container");

		// check if type1 is supported
		check_err((ioctl(cfd, VFIO_CHECK_EXTENSION, VFIO_TYPE1_IOMMU) == 1) - 1, "get Type1 IOMMU support from the IOMMU container");
	}

	// open VFIO group containing the device
	snprintf(path, sizeof(path), "/dev/vfio/%d", groupid);
	int vfio_gfd = check_err(open(path, O_RDWR), "open vfio group");

	// check if group is viable
	struct vfio_group_status group_status = {.argsz = sizeof(group_status)};
	check_err(ioctl(vfio_gfd, VFIO_GROUP_GET_STATUS, &group_status), "get VFIO group status");
	check_err(((group_status.flags & VFIO_GROUP_FLAGS_VIABLE) > 0) - 1, "get viable VFIO group - are all devices in the group bound to the VFIO driver?");

	// Add group to container
	check_err(ioctl(vfio_gfd, VFIO_GROUP_SET_CONTAINER, &cfd), "set container");

	if (firstsetup != 0) {
		// Set vfio type (type1 is for IOMMU like VT-d or AMD-Vi) for the
		// container.
		// This can only be done after at least one group is in the container.
		ret = check_err(ioctl(cfd, VFIO_SET_IOMMU, VFIO_TYPE1_IOMMU), "set IOMMU type");
	}

	// get device file descriptor
	int vfio_fd = check_err(ioctl(vfio_gfd, VFIO_GROUP_GET_DEVICE_FD, pci_addr), "get device fd");

	// enable DMA
	vfio_enable_dma(vfio_fd);

	return vfio_fd;
}